

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O0

void dsfmt_fill_array_close_open(dsfmt_t *dsfmt,double *array,int size)

{
  int size_local;
  double *array_local;
  dsfmt_t *dsfmt_local;
  
  if (size % 2 != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x21e,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
  }
  if (0x17d < size) {
    gen_rand_array_c0o1(dsfmt,(w128_t *)array,size / 2);
    return;
  }
  __assert_fail("size >= DSFMT_N64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                ,0x21f,"void dsfmt_fill_array_close_open(dsfmt_t *, double *, int)");
}

Assistant:

void dsfmt_fill_array_close_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_c0o1(dsfmt, (w128_t *)array, size / 2);
}